

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockIterator.hpp
# Opt level: O0

bool __thiscall
gmlc::containers::BlockIterator<helics::Publication_const,32,helics::Publication_const*const*>::
checkEquivalence<helics::Publication**>
          (BlockIterator<helics::Publication_const,32,helics::Publication_const*const*> *this,
          Publication **testv,int testoffset)

{
  bool local_21;
  int testoffset_local;
  Publication **testv_local;
  BlockIterator<const_helics::Publication,_32,_const_helics::Publication_*const_*> *this_local;
  
  if ((testv == *(Publication ***)this) ||
     ((((local_21 = false, testv != (Publication **)0x0 &&
        (local_21 = false, *testv == (Publication *)0x0)) && (local_21 = false, *(long *)this != 0))
      && (local_21 = false, **(long **)this == 0)))) {
    local_21 = testoffset == *(int *)(this + 0x10);
  }
  return local_21;
}

Assistant:

bool checkEquivalence(OUTER2 testv, int testoffset) const
        {
            return (
                (testv == vec ||
                 ((testv != nullptr && *testv == nullptr) &&
                  (vec != nullptr && *vec == nullptr))) &&
                testoffset == offset);
        }